

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

Matrix_t Traj3_Para_Mat(float init_pos,float init_vel,float final_pos,float final_vel)

{
  Matrix_t MVar1;
  
  MVar1.pMatrix = (float *)calloc(1,0x10);
  if (MVar1.pMatrix == (float *)0x0) {
    printf("ERROR: Malloc failed!-04");
  }
  *MVar1.pMatrix = init_pos;
  MVar1.pMatrix[1] = init_vel;
  MVar1.pMatrix[2] = final_pos;
  MVar1.pMatrix[3] = final_vel;
  MVar1.row = '\x04';
  MVar1.column = '\x01';
  MVar1._10_6_ = 0;
  return MVar1;
}

Assistant:

Matrix_t Traj3_Para_Mat(float init_pos, float init_vel, float final_pos, float final_vel)
{
	int i;
	Matrix_t temp;
	float *coeffi_arr = (float *)malloc(sizeof(float) * 4);
	if (coeffi_arr == NULL)
		printf("ERROR: Malloc failed!-04");
	for (i = 0; i < 4; i++)
		*(coeffi_arr + i) = 0; //MD 原来写的是*(coeffi_arr + 4 * i ) = 0;  我是傻逼  一直内存报错  但是VS真的牛逼  在树莓派上跑竟然没问题
	*(coeffi_arr + 0 * 4 + 0) = init_pos;
	*(coeffi_arr + 0 * 4 + 1) = init_vel;
	*(coeffi_arr + 0 * 4 + 2) = final_pos;
	*(coeffi_arr + 0 * 4 + 3) = final_vel;

	temp.pMatrix = coeffi_arr;
	temp.row = 4;
	temp.column = 1;

	return temp;
}